

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool verifySignature_ECDSA_SHA1(u8 *cert,bool is3DS)

{
  int iVar1;
  undefined7 in_register_00000031;
  u8 *Q;
  u8 hash [20];
  uint8_t auStack_a8 [24];
  SHA1 local_90;
  
  local_90._vptr_SHA1 = (_func_int **)&PTR__SHA1_00106da8;
  local_90.m_digest[0] = 0x67452301;
  local_90.m_digest[1] = 0xefcdab89;
  local_90.m_digest[2] = 0x98badcfe;
  local_90.m_digest[3] = 0x10325476;
  local_90.m_digest[4] = 0xc3d2e1f0;
  local_90.m_blockByteIndex = 0;
  local_90.m_byteCount = 0;
  sha1::SHA1::processBlock(&local_90,cert + 0x80,cert + 0x180);
  sha1::SHA1::getDigestBytes(&local_90,auStack_a8);
  Q = "";
  if ((int)CONCAT71(in_register_00000031,is3DS) != 0) {
    Q = "";
  }
  iVar1 = check_ecdsa(Q,cert + 4,cert + 0x22,auStack_a8,0);
  return iVar1 != 0;
}

Assistant:

bool verifySignature_ECDSA_SHA1(u8 *cert, bool is3DS)
{
    sha1::SHA1 s;
    u8 hash[20];

    s.processBytes(cert + 0x80, CertLength - 0x80);
    s.getDigestBytes(hash);

    return check_ecdsa(const_cast<u8 *>(is3DS ? Q_3DS : Q_WiiU),
        cert + 4, cert + 4 + 30, hash, false);
}